

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void XML_SetExternalEntityRefHandlerArg(XML_Parser parser,void *arg)

{
  if (parser != (XML_Parser)0x0) {
    if (arg == (void *)0x0) {
      arg = parser;
    }
    parser->m_externalEntityRefHandlerArg = (XML_Parser)arg;
  }
  return;
}

Assistant:

void XMLCALL
XML_SetExternalEntityRefHandlerArg(XML_Parser parser, void *arg)
{
  if (parser == NULL)
    return;
  if (arg)
    parser->m_externalEntityRefHandlerArg = (XML_Parser)arg;
  else
    parser->m_externalEntityRefHandlerArg = parser;
}